

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

Abc_Obj_t * Abc_NtkAddBuffsOne(Vec_Ptr_t *vBuffs,Abc_Obj_t *pFanin,int Level,int nLevelMax)

{
  Abc_Obj_t *pAVar1;
  
  if ((int)(*(uint *)&pFanin->field_0x14 >> 0xc) < Level) {
    pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(vBuffs,pFanin->Id * nLevelMax + Level);
    if (pAVar1 == (Abc_Obj_t *)0x0) {
      pAVar1 = pFanin;
      if (Level - 1U != *(uint *)&pFanin->field_0x14 >> 0xc) {
        pAVar1 = Abc_NtkAddBuffsOne(vBuffs,pFanin,Level - 1U,nLevelMax);
      }
      pAVar1 = Abc_NtkCreateNodeBuf(pFanin->pNtk,pAVar1);
      Vec_PtrWriteEntry(vBuffs,nLevelMax * pFanin->Id + Level,pAVar1);
    }
    return pAVar1;
  }
  __assert_fail("Level - 1 >= Abc_ObjLevel(pFanin)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                ,0x91c,"Abc_Obj_t *Abc_NtkAddBuffsOne(Vec_Ptr_t *, Abc_Obj_t *, int, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkAddBuffsOne( Vec_Ptr_t * vBuffs, Abc_Obj_t * pFanin, int Level, int nLevelMax )
{
    Abc_Obj_t * pBuffer;
    assert( Level - 1 >= Abc_ObjLevel(pFanin) );
    pBuffer = (Abc_Obj_t *)Vec_PtrEntry( vBuffs, Abc_ObjId(pFanin) * nLevelMax + Level );
    if ( pBuffer == NULL )
    {
        if ( Level - 1 == Abc_ObjLevel(pFanin) )
            pBuffer = pFanin;
        else
            pBuffer = Abc_NtkAddBuffsOne( vBuffs, pFanin, Level - 1, nLevelMax );
        pBuffer = Abc_NtkCreateNodeBuf( Abc_ObjNtk(pFanin), pBuffer ); 
        Vec_PtrWriteEntry( vBuffs, Abc_ObjId(pFanin) * nLevelMax + Level, pBuffer );
    }
    return pBuffer;
}